

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_api.cc
# Opt level: O2

int XLearnSetDMatrix(XL *out,char *key,DataHandle *out_data)

{
  XL pvVar1;
  DataHandle pvVar2;
  int iVar3;
  runtime_error *this;
  
  pvVar1 = *out;
  iVar3 = strcmp(key,"train");
  if (iVar3 == 0) {
    pvVar2 = *out_data;
    *(DataHandle *)((long)pvVar1 + 0x128) = pvVar2;
    if (*(char *)((long)pvVar2 + 0x60) == '\0') {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"Train set must have label!");
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    iVar3 = strcmp(key,"test");
    if (iVar3 == 0) {
      *(DataHandle *)((long)pvVar1 + 0x130) = *out_data;
    }
    else {
      iVar3 = strcmp(key,"validate");
      if (iVar3 == 0) {
        *(DataHandle *)((long)pvVar1 + 0x138) = *out_data;
      }
    }
  }
  return 0;
}

Assistant:

XL_DLL int XLearnSetDMatrix(XL *out, const char *key, DataHandle *out_data){
  API_BEGIN()
  XLearn* xl = reinterpret_cast<XLearn*>(*out);
  if (strcmp(key, "train") == 0) {
    xl->GetHyperParam().train_dataset = reinterpret_cast<xLearn::DMatrix*>(*out_data);
    if (!xl->GetHyperParam().train_dataset->has_label){
      throw std::runtime_error("Train set must have label!");
    }
  } else if (strcmp(key, "test") == 0) {
    xl->GetHyperParam().test_dataset = reinterpret_cast<xLearn::DMatrix*>(*out_data);
  } else if (strcmp(key, "validate") == 0) {
    xl->GetHyperParam().valid_dataset = reinterpret_cast<xLearn::DMatrix*>(*out_data);
  }
  API_END();
}